

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O3

void LoadFileList(Configuration *config,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                 *components,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                 *files,path *sourceDir,bool inferredComponents,bool withLoc)

{
  undefined1 *__s;
  byte bVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *__n;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentTypes;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  componentTypes_00;
  _Alloc_hider _Var3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  reference pdVar10;
  long lVar11;
  Component *pCVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>
  _Var15;
  size_t __len;
  void *pvVar16;
  char *pcVar17;
  size_t sVar18;
  void *pvVar19;
  int iVar20;
  size_t __n_00;
  undefined8 uVar21;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  ulong uVar22;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_false,_true>,_bool>
  pVar23;
  recursive_directory_iterator it;
  string nextLine;
  string line;
  string fileName;
  __string_type __str;
  recursive_directory_iterator end;
  string pathS;
  path outputpath;
  string fileName_1;
  undefined4 uVar24;
  undefined4 in_stack_fffffffffffffb0c;
  uint uVar25;
  undefined4 uVar26;
  undefined4 in_stack_fffffffffffffb1c;
  recursive_directory_iterator in_stack_fffffffffffffb20;
  string *this;
  _Alloc_hider in_stack_fffffffffffffb30;
  _Alloc_hider _Var27;
  __node_base_ptr in_stack_fffffffffffffb38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  string *local_4b0;
  Configuration *local_4a8;
  char *local_4a0;
  long local_498;
  char local_490 [16];
  long local_480;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *local_478;
  char *local_470;
  ulong local_468;
  char local_460 [16];
  string local_450;
  string *local_430;
  intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp> local_428;
  int local_41c;
  undefined4 local_418;
  undefined4 local_414;
  File *local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string *local_3f8;
  size_type local_3f0;
  undefined8 local_3e8;
  size_t sStack_3e0;
  undefined8 local_3d8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_3d0;
  ios_base *local_3c8;
  _Prime_rehash_policy *local_3c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_3b8;
  _Prime_rehash_policy *local_3b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_3a8;
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 local_380 [24];
  error_category local_368;
  char *local_358 [2];
  char local_348 [16];
  undefined1 local_338 [32];
  _Alloc_hider local_318;
  char local_308 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_2f8;
  _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_2c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_290;
  undefined8 local_238 [33];
  path local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_f0;
  _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_88;
  
  local_418 = (undefined4)CONCAT71(in_register_00000089,withLoc);
  local_414 = (undefined4)CONCAT71(in_register_00000081,inferredComponents);
  local_4a8 = config;
  local_478 = components;
  local_3d0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)files;
  boost::filesystem::detail::current_path((error_code *)&local_130);
  std::__cxx11::string::string
            ((string *)local_338,(sourceDir->m_pathname)._M_dataplus._M_p,
             (allocator *)local_110._M_local_buf);
  boost::filesystem::detail::current_path((path *)local_338,(error_code *)0x0);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,".","");
  AddComponentDefinition(local_478,(path *)local_338);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,".","");
  boost::filesystem::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&stack0xfffffffffffffb20,(path *)local_338);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_);
  }
  local_428.px = (recur_dir_itr_imp *)0x0;
  if (in_stack_fffffffffffffb20.m_imp.px != (recur_dir_itr_imp *)0x0) {
    local_3a8 = &(local_4a8->addLibraryAliases)._M_h;
    local_3b0 = &(local_4a8->addLibraryAliases)._M_h._M_rehash_policy;
    local_3c8 = (ios_base *)local_238;
    local_3b8 = &(local_4a8->addExecutableAliases)._M_h;
    local_3c0 = &(local_4a8->addExecutableAliases)._M_h._M_rehash_policy;
    do {
      if (((in_stack_fffffffffffffb20.m_imp.px == (recur_dir_itr_imp *)0x0) ||
          (*(long *)((long)in_stack_fffffffffffffb20.m_imp.px + 8) ==
           *(long *)((long)in_stack_fffffffffffffb20.m_imp.px + 0x10))) &&
         ((local_428.px == (recur_dir_itr_imp *)0x0 ||
          (*(long *)(local_428.px + 8) == *(long *)(local_428.px + 0x10))))) break;
      boost::filesystem::recursive_directory_iterator::dereference
                ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
      boost::filesystem::path::parent_path();
      boost::filesystem::recursive_directory_iterator::dereference
                ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
      boost::filesystem::path::filename();
      local_470 = local_460;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_470,local_338._0_8_,(pointer)(local_338._0_8_ + local_338._8_8_));
      if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
        operator_delete((void *)local_338._0_8_);
      }
      if ((local_468 < 2) || (*local_470 != '.')) {
        pdVar10 = boost::filesystem::recursive_directory_iterator::dereference
                            ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
        local_338._0_8_ = local_338 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,*(long *)pdVar10,*(long *)(pdVar10 + 8) + *(long *)pdVar10);
        boost::filesystem::path::filename();
        local_110._M_allocated_capacity = (size_type)&local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_408._M_allocated_capacity,
                   local_408._8_8_ + local_408._M_allocated_capacity);
        if ((string **)local_408._M_allocated_capacity != &local_3f8) {
          operator_delete((void *)local_408._M_allocated_capacity);
        }
        for (p_Var2 = (local_4a8->blacklist)._M_h._M_before_begin._M_nxt;
            p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
          iVar8 = std::__cxx11::string::compare((ulong)local_338,2,(string *)p_Var2[2]._M_nxt);
          bVar7 = true;
          if ((iVar8 == 0) ||
             ((__n = p_Var2[2]._M_nxt, __n == (_Hash_node_base *)local_110._8_8_ &&
              ((__n == (_Hash_node_base *)0x0 ||
               (iVar8 = bcmp(p_Var2[1]._M_nxt,(void *)local_110._M_allocated_capacity,(size_t)__n),
               iVar8 == 0)))))) goto LAB_00125dec;
        }
        bVar7 = false;
LAB_00125dec:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_allocated_capacity != &local_100) {
          operator_delete((void *)local_110._M_allocated_capacity);
        }
        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_);
        }
        if (bVar7) goto LAB_00125e3a;
        if ((char)local_414 != '\0') {
          AddComponentDefinition(local_478,(path *)(local_380 + 8));
        }
        boost::filesystem::recursive_directory_iterator::dereference
                  ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
        boost::filesystem::path::filename();
        iVar8 = boost::filesystem::path::compare((path *)local_338,"CMakeLists.txt");
        if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
          operator_delete((void *)local_338._0_8_);
        }
        if (iVar8 == 0) {
          pdVar10 = boost::filesystem::recursive_directory_iterator::dereference
                              ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
          boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
                    ((basic_ifstream<char,_std::char_traits<char>_> *)local_338,(path *)pdVar10);
          local_4a0 = local_490;
          local_498 = 0;
          local_490[0] = '\0';
          boost::filesystem::path::parent_path();
          pCVar12 = AddComponentDefinition(local_478,(path *)&stack0xfffffffffffffb30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffb30._M_p != &local_4c0) {
            operator_delete(in_stack_fffffffffffffb30._M_p);
          }
          local_4b0 = &pCVar12->additionalCmakeDeclarations;
          local_430 = &pCVar12->additionalTargetParameters;
          this = (string *)&pCVar12->name;
          lVar11 = *(long *)(local_338._0_8_ + -0x18);
          iVar8 = 0;
          bVar7 = false;
          uVar25 = 0;
          do {
            cVar4 = std::ios::widen((char)&stack0xfffffffffffffb08 + (char)lVar11 + -0x40);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_338,(string *)&local_4a0,cVar4);
            pcVar17 = local_4a0;
            pcVar13 = strstr(local_4a0,(local_4a8->regenTag)._M_dataplus._M_p);
            if (pcVar13 == (char *)0x0) {
              while (pcVar17[local_498 + -1] == '\\') {
                std::__cxx11::string::pop_back();
                in_stack_fffffffffffffb38 = (__node_base_ptr)0x0;
                local_4c0._M_local_buf[0] = '\0';
                in_stack_fffffffffffffb30._M_p = (pointer)&local_4c0;
                cVar4 = std::ios::widen((char)*(undefined8 *)(local_338._0_8_ + -0x18) +
                                        (char)(istream *)local_338);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_338,(string *)&stack0xfffffffffffffb30,cVar4);
                std::__cxx11::string::_M_append
                          ((char *)&local_4a0,(ulong)in_stack_fffffffffffffb30._M_p);
                pcVar17 = local_4a0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)in_stack_fffffffffffffb30._M_p != &local_4c0) {
                  operator_delete(in_stack_fffffffffffffb30._M_p);
                  pcVar17 = local_4a0;
                }
              }
              if ((local_498 == 0) || (*pcVar17 != '#')) {
                for (uVar14 = std::__cxx11::string::find((char *)&local_4a0,0x12ebd7,0);
                    uVar14 != 0xffffffffffffffff;
                    uVar14 = std::__cxx11::string::find((char *)&local_4a0,0x12ebd7,uVar14 + 2)) {
                  lVar11 = std::__cxx11::string::find((char *)&local_4a0,0x12ebd7,uVar14 + 1);
                  std::__cxx11::string::replace
                            ((ulong)&local_4a0,uVar14 + 1,(char *)(~uVar14 + lVar11),0x12e1f6);
                }
                if (local_498 == 0) {
                  iVar9 = 0;
                  iVar20 = 0;
                }
                else {
                  lVar11 = 0;
                  iVar9 = 0;
                  do {
                    iVar9 = iVar9 + (uint)(local_4a0[lVar11] == '(');
                    lVar11 = lVar11 + 1;
                  } while (local_498 != lVar11);
                  lVar11 = 0;
                  iVar20 = 0;
                  do {
                    iVar20 = iVar20 + (uint)(local_4a0[lVar11] == ')');
                    lVar11 = lVar11 + 1;
                  } while (local_498 != lVar11);
                }
                iVar8 = (iVar8 + iVar9) - iVar20;
                iVar9 = strncmp(local_4a0,"project(",8);
                cVar4 = (char)(string *)&local_4a0;
                if (iVar9 == 0) {
                  lVar11 = std::__cxx11::string::find(cVar4,0x29);
                  if (lVar11 != -1) {
                    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffb30,(ulong)&local_4a0);
                    std::__cxx11::string::operator=(this,(string *)&stack0xfffffffffffffb30);
                    _Var3._M_p = in_stack_fffffffffffffb30._M_p;
                    _Var27._M_p = in_stack_fffffffffffffb30._M_p;
joined_r0x001265d4:
                    in_stack_fffffffffffffb30._M_p = _Var27._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var3._M_p != &local_4c0) {
                      operator_delete(_Var3._M_p);
                    }
                  }
                }
                else {
                  local_110._M_allocated_capacity = 0;
                  local_110._8_8_ = (local_4a8->addLibraryAliases)._M_h._M_bucket_count;
                  local_100._M_allocated_capacity = 0;
                  local_100._8_8_ = (local_4a8->addLibraryAliases)._M_h._M_element_count;
                  local_f0._M_impl._0_4_ = local_3b0->_M_max_load_factor;
                  local_f0._M_impl._4_4_ = *(undefined4 *)&local_3b0->field_0x4;
                  local_f0._M_impl.super__Rb_tree_header._M_header._0_8_ = local_3b0->_M_next_resize
                  ;
                  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  in_stack_fffffffffffffb30._M_p = (pointer)&local_110;
                  std::
                  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  ::
                  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              *)in_stack_fffffffffffffb30._M_p,local_3a8,
                             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                              *)&stack0xfffffffffffffb30);
                  componentTypes._M_h._M_buckets._4_4_ = in_stack_fffffffffffffb0c;
                  componentTypes._M_h._M_buckets._0_4_ = iVar8;
                  componentTypes._M_h._M_bucket_count = (size_type)pCVar12;
                  componentTypes._M_h._M_before_begin._M_nxt._0_4_ = uVar25;
                  componentTypes._M_h._M_before_begin._M_nxt._4_4_ = in_stack_fffffffffffffb1c;
                  componentTypes._M_h._M_element_count =
                       (size_type)in_stack_fffffffffffffb20.m_imp.px;
                  componentTypes._M_h._M_rehash_policy._0_8_ = this;
                  componentTypes._M_h._M_rehash_policy._M_next_resize =
                       (size_t)in_stack_fffffffffffffb30._M_p;
                  componentTypes._M_h._M_single_bucket = in_stack_fffffffffffffb38;
                  bVar5 = TryGetComponentType(pCVar12,componentTypes,
                                              (string *)local_100._M_allocated_capacity);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 *)&local_110);
                  uVar21 = extraout_RAX;
                  if (!bVar5) {
                    local_408._M_allocated_capacity = 0;
                    local_408._8_8_ = (local_4a8->addExecutableAliases)._M_h._M_bucket_count;
                    local_3f8 = (string *)0x0;
                    local_3f0 = (local_4a8->addExecutableAliases)._M_h._M_element_count;
                    local_3e8 = *(undefined8 *)local_3c0;
                    sStack_3e0 = local_3c0->_M_next_resize;
                    local_3d8 = 0;
                    in_stack_fffffffffffffb30._M_p = (pointer)&local_408;
                    std::
                    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    ::
                    _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                *)in_stack_fffffffffffffb30._M_p,local_3b8,
                               (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                                *)&stack0xfffffffffffffb30);
                    componentTypes_00._M_h._M_buckets._4_4_ = in_stack_fffffffffffffb0c;
                    componentTypes_00._M_h._M_buckets._0_4_ = iVar8;
                    componentTypes_00._M_h._M_bucket_count = (size_type)pCVar12;
                    componentTypes_00._M_h._M_before_begin._M_nxt._0_4_ = uVar25;
                    componentTypes_00._M_h._M_before_begin._M_nxt._4_4_ = in_stack_fffffffffffffb1c;
                    componentTypes_00._M_h._M_element_count =
                         (size_type)in_stack_fffffffffffffb20.m_imp.px;
                    componentTypes_00._M_h._M_rehash_policy._0_8_ = this;
                    componentTypes_00._M_h._M_rehash_policy._M_next_resize =
                         (size_t)in_stack_fffffffffffffb30._M_p;
                    componentTypes_00._M_h._M_single_bucket = in_stack_fffffffffffffb38;
                    bVar5 = TryGetComponentType(pCVar12,componentTypes_00,local_3f8);
                    std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   *)&local_408);
                    uVar21 = extraout_RAX_00;
                    if (!bVar5) {
                      if ((uVar25 & 1) == 0) {
                        if (local_4a8->reuseCustomSections == true) {
                          local_358[0] = local_348;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_358,local_4a0,local_4a0 + local_498);
                          pcVar17 = local_358[0];
                          pcVar13 = strstr(local_358[0],"target_link_libraries(");
                          bVar5 = true;
                          uVar24 = SUB84(pcVar17,0);
                          in_stack_fffffffffffffb1c = (undefined4)((ulong)pcVar17 >> 0x20);
                          if (pcVar13 == (char *)0x0) {
                            pcVar13 = strstr(pcVar17,"add_subdirectory(");
                            if (((((pcVar13 == (char *)0x0) &&
                                  (pcVar13 = strstr(pcVar17,"target_include_directories("),
                                  pcVar13 == (char *)0x0)) &&
                                 (pcVar13 = strstr(pcVar17,"add_dependencies("),
                                 pcVar13 == (char *)0x0)) &&
                                ((pcVar13 = strstr(pcVar17,"include(CMakeAddon.txt)"),
                                 pcVar13 == (char *)0x0 &&
                                 (pcVar13 = strstr(pcVar17,"source_group(\"Implementation\\"),
                                 pcVar13 == (char *)0x0)))) &&
                               (pcVar13 = strstr(pcVar17,"set(IMPLEMENTATION_SOURCES"),
                               pcVar13 == (char *)0x0)) {
                              pcVar17 = strstr(pcVar17,"set(IMPLEMENTATION_HEADERS");
                              bVar5 = true;
                              if (pcVar17 == (char *)0x0) {
                                pcVar17 = strstr((char *)CONCAT44(in_stack_fffffffffffffb1c,uVar24),
                                                 "set(INTERFACE_FILES");
                                bVar5 = pcVar17 != (char *)0x0;
                              }
                            }
                            else {
                              bVar5 = true;
                            }
                          }
                          if ((char *)CONCAT44(in_stack_fffffffffffffb1c,uVar24) != local_348) {
                            operator_delete((char *)CONCAT44(in_stack_fffffffffffffb1c,uVar24));
                          }
                          bVar6 = true;
                          if (((!bVar5) && (bVar6 = bVar7, !bVar7)) && (local_498 != 0)) {
                            in_stack_fffffffffffffb30._M_p = (pointer)&local_4c0;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&stack0xfffffffffffffb30,local_4a0,
                                       local_4a0 + local_498);
                            std::__cxx11::string::_M_replace_aux
                                      ((ulong)&stack0xfffffffffffffb30,
                                       (ulong)in_stack_fffffffffffffb38,0,'\x01');
                            std::__cxx11::string::_M_append
                                      ((char *)local_4b0,(ulong)in_stack_fffffffffffffb30._M_p);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)in_stack_fffffffffffffb30._M_p != &local_4c0) {
                              operator_delete(in_stack_fffffffffffffb30._M_p);
                            }
                          }
                          bVar7 = bVar6;
                          if (iVar8 == 0) {
                            bVar7 = false;
                          }
                          if (!bVar6) {
                            bVar7 = bVar6;
                          }
                        }
                        uVar25 = 0;
                      }
                      else {
                        uVar25 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),iVar8 != 0);
                        lVar11 = local_498;
                        if (iVar8 == 0) {
                          lVar11 = std::__cxx11::string::rfind(cVar4,0x29);
                        }
                        if (lVar11 != 0) {
                          std::__cxx11::string::substr
                                    ((ulong)&stack0xfffffffffffffb30,(ulong)&local_4a0);
                          _Var27._M_p = in_stack_fffffffffffffb30._M_p;
                          pcVar17 = strstr(in_stack_fffffffffffffb30._M_p,
                                           "${IMPLEMENTATION_SOURCES}");
                          _Var3._M_p = in_stack_fffffffffffffb30._M_p;
                          if ((pcVar17 == (char *)0x0) &&
                             (pcVar17 = strstr(in_stack_fffffffffffffb30._M_p,
                                               "${IMPLEMENTATION_HEADERS}"), pcVar17 == (char *)0x0)
                             ) {
                            local_3a0[0] = local_390;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)local_3a0,in_stack_fffffffffffffb30._M_p,
                                       (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)(in_stack_fffffffffffffb30._M_p +
                                          (long)&in_stack_fffffffffffffb38->_M_nxt));
                            boost::filesystem::path::extension();
                            bVar5 = IsCode(&local_450);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
                              operator_delete(local_450._M_dataplus._M_p);
                            }
                            if (local_3a0[0] != local_390) {
                              operator_delete(local_3a0[0]);
                            }
                            _Var3._M_p = _Var27._M_p;
                            if (!bVar5) {
                              local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_450,_Var27._M_p,
                                         (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)(_Var27._M_p + (long)&in_stack_fffffffffffffb38->_M_nxt)
                                        );
                              std::__cxx11::string::_M_replace_aux
                                        ((ulong)&local_450,local_450._M_string_length,0,'\x01');
                              std::__cxx11::string::_M_append
                                        ((char *)local_430,(ulong)local_450._M_dataplus._M_p);
                              _Var3._M_p = _Var27._M_p;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_450._M_dataplus._M_p != &local_450.field_2) {
                                operator_delete(local_450._M_dataplus._M_p);
                                _Var3._M_p = _Var27._M_p;
                              }
                            }
                          }
                          goto joined_r0x001265d4;
                        }
                      }
                      goto LAB_00126085;
                    }
                  }
                  uVar25 = (uint)CONCAT71((int7)((ulong)uVar21 >> 8),1);
                }
              }
            }
            else {
              pCVar12->recreate = true;
            }
LAB_00126085:
            lVar11 = *(long *)(local_338._0_8_ + -0x18);
          } while (*(int *)((long)&local_318._M_p + lVar11) == 0);
          if (iVar8 != 0) {
            printf("final level of parentheses=%d\n");
            __assert_fail("parenLevel == 0 || (printf(\"final level of parentheses=%d\\n\", parenLevel), 0)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dascandy[P]cpp-dependencies/src/Input.cpp"
                          ,0x13c,
                          "void ReadCmakelist(const Configuration &, std::unordered_map<std::string, Component *> &, const filesystem::path &)"
                         );
          }
          if (local_4a0 != local_490) {
            operator_delete(local_4a0);
          }
          local_338._0_8_ =
               std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
               construction_vtable + 0x18;
          local_238[0] = 0x137b70;
          std::filebuf::~filebuf((filebuf *)(local_338 + 0x10));
          local_338._0_8_ =
               std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
               construction_vtable + 0x18;
          local_238[0] = 0x137bc0;
          local_338._8_8_ = 0;
          std::ios_base::~ios_base(local_3c8);
        }
        else {
          boost::filesystem::recursive_directory_iterator::dereference
                    ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
          boost::filesystem::directory_entry::get_status((error_code *)local_380);
          if (local_380._0_4_ == 2) {
            pdVar10 = boost::filesystem::recursive_directory_iterator::dereference
                                ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
            lVar11 = std::__cxx11::string::find((char *)pdVar10,0x12e64d,0);
            if (lVar11 == -1) {
              boost::filesystem::recursive_directory_iterator::dereference
                        ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
              boost::filesystem::path::extension();
              bVar7 = IsCode((string *)local_338);
              if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                operator_delete((void *)local_338._0_8_);
              }
              if (bVar7) {
                __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      boost::filesystem::recursive_directory_iterator::dereference
                                ((recursive_directory_iterator *)&stack0xfffffffffffffb20);
                File::File((File *)&local_110,(path *)__x);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
                ::pair<File,_true>((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>
                                    *)local_338,__x,(File *)&local_110);
                pVar23 = std::
                         _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,File>,std::allocator<std::pair<std::__cxx11::string_const,File>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         ::_M_emplace<std::pair<std::__cxx11::string,File>>(local_3d0);
                _Var15 = pVar23.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                         ._M_cur;
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::~_Hashtable(&local_290);
                std::
                _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_2c8);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::~_Rb_tree(&local_2f8);
                if (local_318._M_p != local_308) {
                  operator_delete(local_318._M_p);
                }
                if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                  operator_delete((void *)local_338._0_8_);
                }
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::~_Hashtable(&local_88);
                std::
                _Hashtable<File_*,_File_*,_std::allocator<File_*>,_std::__detail::_Identity,_std::equal_to<File_*>,_std::hash<File_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::~_Hashtable(&local_c0);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                ::~_Rb_tree(&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_allocated_capacity != &local_100) {
                  operator_delete((void *)local_110._M_allocated_capacity);
                }
                iVar8 = open((__x->_M_dataplus)._M_p,0);
                __len = boost::filesystem::detail::file_size((path *)__x,(error_code *)0x0);
                local_41c = iVar8;
                pvVar16 = mmap((void *)0x0,__len,1,2,iVar8,0);
                if (__len != 0) {
                  uVar24 = SUB84(pvVar16,0);
                  in_stack_fffffffffffffb0c = (undefined4)((ulong)pvVar16 >> 0x20);
                  sVar18 = __len;
                  pcVar17 = (char *)memrchr(pvVar16,0x23,__len);
                  __n_00 = __len;
                  __len = sVar18;
                  if ((pcVar17 != (char *)0x0) &&
                     ((iVar8 = strncmp(pcVar17,"#endif",6), __len = sVar18, iVar8 != 0 ||
                      (pcVar17 = (char *)memrchr((void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24),
                                                 0x23,(size_t)(pcVar17 +
                                                              ~CONCAT44(in_stack_fffffffffffffb0c,
                                                                        uVar24))), __n_00 = sVar18,
                      __len = sVar18, pcVar17 != (char *)0x0)))) {
                    lVar11 = CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                    pvVar16 = memchr(pcVar17,10,(__len + lVar11) - (long)pcVar17);
                    __n_00 = (long)pvVar16 - lVar11;
                    if (pvVar16 == (void *)0x0) {
                      __n_00 = __len;
                    }
                  }
                  if ((char)local_418 == '\0') {
                    pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                    if (__n_00 != 0) goto LAB_00126a15;
                  }
                  else {
                    *(undefined8 *)
                     ((long)_Var15.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                            ._M_cur + 0xf0) = 0;
                    pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                    if (__n_00 != 0) {
                      sVar18 = 0;
                      lVar11 = 0;
                      do {
                        if (*(char *)((long)pvVar16 + sVar18) == '\n') {
                          lVar11 = lVar11 + 1;
                          *(long *)((long)_Var15.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                          ._M_cur + 0xf0) = lVar11;
                        }
                        sVar18 = sVar18 + 1;
                      } while (__n_00 != sVar18);
LAB_00126a15:
                      local_410 = (File *)((long)_Var15.
                                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                                                 ._M_cur + 0x28);
                      local_4b0 = (string *)
                                  memchr((void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24),0x2f,
                                         __n_00);
                      pvVar19 = memchr((void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24),0x23,
                                       __n_00);
                      pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                      uVar26 = SUB84(pvVar19,0);
                      in_stack_fffffffffffffb1c = (undefined4)((ulong)pvVar19 >> 0x20);
                      local_430 = (string *)((long)pvVar16 + 1);
                      local_480 = 0;
                      uVar22 = 0;
                      uVar21 = 0;
                      uVar14 = __n_00;
                      do {
                        switch(uVar21) {
                        case 0:
                          if (CONCAT44(in_stack_fffffffffffffb1c,uVar26) == 0) goto LAB_00126dbb;
                          __s = (undefined1 *)((long)pvVar16 + uVar22);
                          if ((undefined1 *)CONCAT44(in_stack_fffffffffffffb1c,uVar26) < __s) {
                            __n_00 = uVar14;
                            pvVar19 = memchr(__s,0x23,uVar14 - uVar22);
                            pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                            uVar26 = SUB84(pvVar19,0);
                            in_stack_fffffffffffffb1c = (undefined4)((ulong)pvVar19 >> 0x20);
                            uVar14 = __n_00;
                            if (pvVar19 == (void *)0x0) goto LAB_00126dbb;
                          }
                          if (local_4b0 == (string *)0x0) {
                            local_4b0 = (string *)0x0;
                          }
                          else {
                            if (local_4b0 < __s) {
                              __n_00 = uVar14;
                              local_4b0 = (string *)memchr(__s,0x2f,uVar14 - uVar22);
                              pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                              uVar14 = __n_00;
                            }
                            if ((local_4b0 != (string *)0x0) &&
                               (local_4b0 < (undefined1 *)CONCAT44(in_stack_fffffffffffffb1c,uVar26)
                               )) {
                              uVar22 = (long)local_4b0 - (long)pvVar16;
                              cVar4 = *(char *)((long)&(local_4b0->_M_dataplus)._M_p + 1);
                              uVar21 = 0;
                              if (cVar4 == '/') {
                                __n_00 = uVar14;
                                pvVar19 = memchr(local_4b0,10,uVar14 - uVar22);
                                pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                                uVar22 = (long)pvVar19 - (long)pvVar16;
                                uVar14 = __n_00;
                              }
                              else if (cVar4 == '*') {
                                do {
                                  __n_00 = uVar14;
                                  pvVar19 = memchr((void *)((long)&(local_430->_M_dataplus)._M_p +
                                                           uVar22),0x2f,__n_00 - uVar22);
                                  pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                                  if (pvVar19 == (void *)0x0) goto LAB_00126dbb;
                                  uVar22 = (long)pvVar19 - (long)pvVar16;
                                  uVar14 = __n_00;
                                } while (*(char *)((long)pvVar19 + -1) != '*');
                              }
                              break;
                            }
                          }
                          uVar22 = CONCAT44(in_stack_fffffffffffffb1c,uVar26) - (long)pvVar16;
                          uVar21 = 1;
                          break;
                        case 1:
                          cVar4 = *(char *)((long)pvVar16 + uVar22);
                          uVar21 = 1;
                          if ((cVar4 != '\t') && (cVar4 != ' ')) {
                            if (cVar4 == 'i') {
                              cVar4 = *(char *)((long)pvVar16 + uVar22 + 1);
                              if (cVar4 == 'n') {
                                if ((((*(char *)((long)pvVar16 + uVar22 + 2) == 'c') &&
                                     (*(char *)((long)pvVar16 + uVar22 + 3) == 'l')) &&
                                    (*(char *)((long)pvVar16 + uVar22 + 4) == 'u')) &&
                                   ((*(char *)((long)pvVar16 + uVar22 + 5) == 'd' &&
                                    (*(char *)((long)pvVar16 + uVar22 + 6) == 'e')))) {
                                  uVar22 = uVar22 + 6;
                                  goto LAB_00126da6;
                                }
                              }
                              else if (((cVar4 == 'm') &&
                                       (*(char *)((long)pvVar16 + uVar22 + 2) == 'p')) &&
                                      ((*(char *)((long)pvVar16 + uVar22 + 3) == 'o' &&
                                       ((*(char *)((long)pvVar16 + uVar22 + 4) == 'r' &&
                                        (*(char *)((long)pvVar16 + uVar22 + 5) == 't')))))) {
                                uVar22 = uVar22 + 5;
LAB_00126da6:
                                uVar21 = 2;
                                break;
                              }
                            }
LAB_00126dad:
                            uVar21 = 0;
                          }
                          break;
                        case 2:
                          bVar1 = *(byte *)((long)pvVar16 + uVar22);
                          if (bVar1 < 0x22) {
                            uVar21 = 2;
                            if ((bVar1 != 9) && (bVar1 != 0x20)) goto LAB_00126dad;
                          }
                          else if (bVar1 == 0x22) {
                            local_480 = uVar22 + 1;
                            uVar21 = 4;
                          }
                          else {
                            if (bVar1 != 0x3c) goto LAB_00126dad;
                            local_480 = uVar22 + 1;
                            uVar21 = 3;
                          }
                          break;
                        case 3:
                          cVar4 = *(char *)((long)pvVar16 + uVar22);
                          if (cVar4 != '>') {
                            uVar21 = 3;
                            goto LAB_00126bd2;
                          }
                          local_338._0_8_ = local_338 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_338,(long)pvVar16 + local_480,
                                     (long)pvVar16 + uVar22);
                          File::AddIncludeStmt(local_410,true,(string *)local_338);
                          __n_00 = uVar14;
LAB_00126d1a:
                          if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
                            operator_delete((void *)local_338._0_8_);
                          }
                          uVar21 = 0;
                          pvVar16 = (void *)CONCAT44(in_stack_fffffffffffffb0c,uVar24);
                          uVar14 = __n_00;
                          break;
                        case 4:
                          cVar4 = *(char *)((long)pvVar16 + uVar22);
                          if (cVar4 == '\"') {
                            local_338._0_8_ = local_338 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_338,(long)pvVar16 + local_480,
                                       (long)pvVar16 + uVar22);
                            File::AddIncludeStmt(local_410,false,(string *)local_338);
                            __n_00 = uVar14;
                            goto LAB_00126d1a;
                          }
                          uVar21 = 4;
LAB_00126bd2:
                          if (cVar4 == '\n') goto LAB_00126dad;
                        }
                        uVar22 = uVar22 + 1;
                      } while (uVar22 < __n_00);
                    }
                  }
                }
LAB_00126dbb:
                munmap(pvVar16,__len);
                close(local_41c);
              }
            }
            else {
              pCVar12 = AddComponentDefinition(local_478,(path *)(local_380 + 8));
              pCVar12->hasAddonCmake = true;
            }
          }
        }
      }
      else {
LAB_00125e3a:
        boost::filesystem::recursive_directory_iterator::disable_recursion_pending
                  ((recursive_directory_iterator *)&stack0xfffffffffffffb20,true);
      }
      if (local_470 != local_460) {
        operator_delete(local_470);
      }
      if ((error_category *)local_380._8_8_ != &local_368) {
        operator_delete((void *)local_380._8_8_);
      }
      boost::filesystem::detail::recursive_directory_iterator_increment
                ((recursive_directory_iterator *)&stack0xfffffffffffffb20,(error_code *)0x0);
    } while (in_stack_fffffffffffffb20.m_imp.px !=
             (intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>)local_428.px);
  }
  boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr(&local_428);
  boost::intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp>::~intrusive_ptr
            ((intrusive_ptr<boost::filesystem::detail::recur_dir_itr_imp> *)&stack0xfffffffffffffb20
            );
  boost::filesystem::detail::current_path(&local_130,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.m_pathname._M_dataplus._M_p != &local_130.m_pathname.field_2) {
    operator_delete(local_130.m_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadFileList(const Configuration& config,
                  std::unordered_map<std::string, Component *> &components,
                  std::unordered_map<std::string, File>& files,
                  const filesystem::path& sourceDir,
                  bool inferredComponents,
                  bool withLoc) {
    filesystem::path outputpath = filesystem::current_path();
    filesystem::current_path(sourceDir.c_str());
    AddComponentDefinition(components, ".");
    for (filesystem::recursive_directory_iterator it("."), end;
         it != end; ++it) {
        const auto &parent = it->path().parent_path();

        // skip hidden files and dirs
        std::string fileName = it->path().filename().generic_string();
        if ((fileName.size() >= 2 && fileName[0] == '.') ||
            IsItemBlacklisted(config, it->path())) {
#ifdef WITH_BOOST
            it.no_push();
#else
            it.disable_recursion_pending();
#endif
            continue;
        }       

        if (inferredComponents) AddComponentDefinition(components, parent);

        if (it->path().filename() == "CMakeLists.txt") {
            ReadCmakelist(config, components, it->path());
        } else if (filesystem::is_regular_file(it->status())) {
            if (it->path().generic_string().find("CMakeAddon.txt") != std::string::npos) {
                AddComponentDefinition(components, parent).hasAddonCmake = true;
            } else if (IsCode(it->path().extension().generic_string())) {
                ReadCode(files, it->path(), withLoc);
            }
        }
    }
    filesystem::current_path(outputpath);
}